

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O0

void msocket_ary_create(msocket_ary_t *self,_func_void_void_ptr *pDestructor)

{
  _func_void_void_ptr *pDestructor_local;
  msocket_ary_t *self_local;
  
  self->ppAlloc = (void **)0x0;
  self->pFirst = (void **)0x0;
  self->s32AllocLen = 0;
  self->s32CurLen = 0;
  self->pDestructor = pDestructor;
  self->pFillElem = (void *)0x0;
  self->destructorEnable = true;
  return;
}

Assistant:

void msocket_ary_create(msocket_ary_t* self, void (*pDestructor)(void*)) {
   self->ppAlloc = (void**)0;
   self->pFirst = (void**)0;
   self->s32AllocLen = 0;
   self->s32CurLen = 0;
   self->pDestructor = pDestructor;
   self->pFillElem = (void*)0;
   self->destructorEnable = true;
}